

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_float_Test::TestBody
          (ByteBufferTest_test_read_write_float_Test *this)

{
  char *pcVar1;
  AssertHelper local_90;
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  float float2;
  float float1;
  ByteBuffer byte_buffer2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer byte_buffer1;
  
  float1 = 4334.32;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer1,4);
  bidfx_public_api::tools::ByteBuffer::WriteFloat(4334.32);
  gtest_ar_1._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadFloat();
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&byte_buffer2,"float1","byte_buffer1.ReadFloat()",&float1,
             (float *)&gtest_ar_1);
  if (byte_buffer2 == (ByteBuffer)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xb1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_60);
  float2 = -435.32;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer2,4);
  bidfx_public_api::tools::ByteBuffer::WriteFloat(-435.32);
  local_90.data_._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadFloat();
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar_1,"float2","byte_buffer2.ReadFloat()",&float2,(float *)&local_90)
  ;
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xb6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer2);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer1);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_float)
{
    float float1 = 4334.32f;
    ByteBuffer byte_buffer1(4);
    byte_buffer1.WriteFloat(float1);
    EXPECT_EQ(float1, byte_buffer1.ReadFloat());

    float float2 = -435.32f;
    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteFloat(float2);
    EXPECT_EQ(float2, byte_buffer2.ReadFloat());
}